

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Copy(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                   uint32_t startYOut,uint32_t width,uint32_t height)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  ImageManager manager;
  CopyForm3 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  CopyForm3 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  ImageTypeManager *in_stack_fffffffffffffef0;
  ImageManager *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  uint8_t in_stack_ffffffffffffff1f;
  ImageTypeManager *in_stack_ffffffffffffff20;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  undefined1 local_60 [24];
  undefined1 *local_48;
  uint8_t local_39;
  CopyForm3 functionName;
  CopyForm3 p_Var4;
  ImageTypeManager *pIVar5;
  
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  functionName = pFVar2->Copy;
  local_39 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((functionName == (CopyForm3)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_48 = local_60;
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (!bVar1) break;
      pIVar5 = this;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_68);
      pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
      p_Var4 = pFVar2->Copy;
      if (p_Var4 != (CopyForm3)0x0) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_68);
        local_39 = *puVar3;
        in_stack_fffffffffffffef0 = this;
        functionName = p_Var4;
        this = pIVar5;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_68);
      in_stack_fffffffffffffef0 = this;
      this = pIVar5;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0);
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)this,(char *)functionName);
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             requiredType);
  (*functionName)(in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void Copy( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height )
    {
        initialize( in, Copy )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
    }